

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

JSON * readJson_abi_cxx11_(void)

{
  long lVar1;
  JSON *in_RDI;
  allocator local_31;
  string local_30 [8];
  string filename;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            (local_30,
             "/workspace/llm4binary/github/license_all_cmakelists_25/peakchen90[P]json-parser-cpp/src/test.cpp"
             ,&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  lVar1 = std::__cxx11::string::length();
  std::__cxx11::string::replace((ulong)local_30,lVar1 - 8,(char *)0x8);
  JSON::readFile(in_RDI,(string *)local_30);
  std::__cxx11::string::~string(local_30);
  return in_RDI;
}

Assistant:

string readJson() {
    string filename = __FILE__;
    filename.replace(filename.length() - 8, 8, "test.json");
    return JSON::readFile(filename);
}